

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O2

void lejp_check_path_match(lejp_ctx *ctx)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  char *pcVar10;
  byte bVar11;
  char *pcVar6;
  
  sVar4 = 8;
  if (ctx->path_stride != 0) {
    sVar4 = ctx->path_stride;
  }
  if (ctx->path_match != '\0') {
    return;
  }
  bVar1 = ctx->pst_sp;
  bVar2 = ctx->pst[bVar1].count_paths;
  uVar8 = 0;
LAB_001052cb:
  ctx->wildcount = '\0';
  if (uVar8 == bVar2) {
    return;
  }
  pcVar5 = *(char **)((long)ctx->pst[bVar1].paths + sVar4 * uVar8);
  pcVar10 = ctx->path;
  bVar11 = 0;
LAB_001052ef:
  iVar7 = (-0xec - (int)ctx) + (int)pcVar10;
  pcVar6 = pcVar5;
  do {
    pcVar5 = pcVar6 + 1;
    cVar3 = *pcVar6;
    if (*pcVar10 == '\0') {
      if (cVar3 == '\0') {
        ctx->path_match = (char)uVar8 + '\x01';
        ctx->path_match_len = ctx->pst[bVar1].ppos;
        return;
      }
LAB_00105355:
      uVar8 = uVar8 + 1;
      goto LAB_001052cb;
    }
    if (cVar3 == '\0') goto LAB_00105355;
    if (cVar3 == '*') break;
    if (*pcVar10 != cVar3) goto LAB_00105355;
    pcVar10 = pcVar10 + 1;
    iVar7 = iVar7 + 1;
    pcVar6 = pcVar5;
  } while( true );
  bVar9 = bVar11 + 1;
  ctx->wildcount = bVar9;
  ctx->wild[bVar11] = (uint16_t)iVar7;
  do {
    bVar11 = bVar9;
    if (*pcVar10 == '.') {
      if (*pcVar5 != '\0') goto LAB_001052ef;
    }
    else if (*pcVar10 == '\0') goto LAB_001052ef;
    pcVar10 = pcVar10 + 1;
  } while( true );
}

Assistant:

void
lejp_check_path_match(struct lejp_ctx *ctx)
{
	const char *p, *q;
	int n;
	size_t s = sizeof(char *);

	if (ctx->path_stride)
		s = ctx->path_stride;

	/* we only need to check if a match is not active */
	for (n = 0; !ctx->path_match &&
	     n < ctx->pst[ctx->pst_sp].count_paths; n++) {
		ctx->wildcount = 0;
		p = ctx->path;

		q = *((char **)(((char *)ctx->pst[ctx->pst_sp].paths) + (n * s)));

		while (*p && *q) {
			if (*q != '*') {
				if (*p != *q)
					break;
				p++;
				q++;
				continue;
			}
			ctx->wild[ctx->wildcount++] = lws_ptr_diff(p, ctx->path);
			q++;
			/*
			 * if * has something after it, match to .
			 * if ends with *, eat everything.
			 * This implies match sequences must be ordered like
			 *  x.*.*
			 *  x.*
			 * if both options are possible
			 */
			while (*p && (*p != '.' || !*q))
				p++;
		}
		if (*p || *q)
			continue;

		ctx->path_match = n + 1;
		ctx->path_match_len = ctx->pst[ctx->pst_sp].ppos;
		return;
	}

	if (!ctx->path_match)
		ctx->wildcount = 0;
}